

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O0

MPP_RET hal_task_group_init(HalTaskGroup *group,RK_S32 stage_cnt,RK_S32 task_cnt,RK_S32 task_size)

{
  list_head *plVar1;
  uint uVar2;
  list_head *plVar3;
  list_head *_new;
  HalTaskImpl *task;
  RK_S32 i;
  RK_U8 *buf;
  RK_S32 aligned_size;
  HalTaskGroupImpl *p;
  RK_S32 task_size_local;
  RK_S32 task_cnt_local;
  RK_S32 stage_cnt_local;
  HalTaskGroup *group_local;
  
  if ((((group == (HalTaskGroup *)0x0) || (stage_cnt < 0)) || (task_cnt < 0)) || (task_size < 0)) {
    _mpp_log_l(2,"hal_task","found invalid input group %p stage %d task %d size %d\n",
               "hal_task_group_init",group,(ulong)(uint)stage_cnt,task_cnt,task_size);
    group_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    uVar2 = task_size + 7U & 0xfffffff8;
    plVar3 = (list_head *)
             mpp_osal_calloc("hal_task_group_init",
                             ((long)(int)uVar2 + 0x28) * (long)task_cnt + 0x40 +
                             (long)stage_cnt * 0x10 + (long)stage_cnt * 4);
    if (plVar3 == (list_head *)0x0) {
      _mpp_log_l(2,"hal_task","malloc group failed\n","hal_task_group_init");
      *group = (HalTaskGroup)0x0;
      group_local._4_4_ = MPP_NOK;
    }
    else {
      *(RK_S32 *)&plVar3->next = stage_cnt;
      *(RK_S32 *)((long)&plVar3->next + 4) = task_cnt;
      *(RK_S32 *)&plVar3[2].next = task_size;
      *(uint *)((long)&plVar3[2].next + 4) = uVar2;
      plVar3[2].prev = plVar3 + 4;
      plVar3[3].next = plVar3[2].prev + stage_cnt;
      plVar3[3].prev = (list_head *)((long)&(plVar3[3].next)->next + (long)stage_cnt * 4);
      mpp_spinlock_init((spinlock_t *)&plVar3->prev);
      for (task._4_4_ = 0; task._4_4_ < stage_cnt; task._4_4_ = task._4_4_ + 1) {
        plVar3[2].prev[task._4_4_].next = plVar3[2].prev + task._4_4_;
        plVar3[2].prev[task._4_4_].prev = plVar3[2].prev + task._4_4_;
      }
      plVar1 = plVar3[3].prev;
      for (task._4_4_ = 0; task._4_4_ < task_cnt; task._4_4_ = task._4_4_ + 1) {
        _new = (list_head *)((long)plVar3[3].prev + (long)task._4_4_ * 0x28);
        _new->next = _new;
        _new->prev = _new;
        *(int *)&_new[1].prev = task._4_4_;
        _new[1].next = plVar3;
        *(undefined4 *)((long)&_new[1].prev + 4) = 0;
        _new[2].next = (list_head *)
                       ((long)plVar1 + (long)(int)(task._4_4_ * uVar2) + (long)task_cnt * 0x28);
        list_add_tail(_new,plVar3[2].prev);
        *(int *)&(plVar3[3].next)->next = *(int *)&(plVar3[3].next)->next + 1;
      }
      *group = plVar3;
      group_local._4_4_ = MPP_OK;
    }
  }
  return group_local._4_4_;
}

Assistant:

MPP_RET hal_task_group_init(HalTaskGroup *group, RK_S32 stage_cnt, RK_S32 task_cnt, RK_S32 task_size)
{
    if (NULL == group || stage_cnt < 0 || task_cnt < 0 || task_size < 0) {
        mpp_err_f("found invalid input group %p stage %d task %d size %d\n",
                  group, stage_cnt, task_cnt, task_size);
        return MPP_ERR_UNKNOW;
    }

    HalTaskGroupImpl *p = NULL;
    RK_S32 aligned_size = MPP_ALIGN(task_size, sizeof(void *));

    do {
        RK_U8 *buf = NULL;
        RK_S32 i;

        p = mpp_calloc_size(HalTaskGroupImpl, sizeof(HalTaskGroupImpl) +
                            (sizeof(HalTaskImpl) + aligned_size) * task_cnt +
                            (sizeof(struct list_head)) * stage_cnt +
                            (sizeof(RK_U32)) * stage_cnt);
        if (NULL == p) {
            mpp_err_f("malloc group failed\n");
            break;
        }

        p->stage_count = stage_cnt;
        p->task_count = task_cnt;
        p->size = task_size;
        p->aligned_size = aligned_size;
        p->list = (struct list_head *)((HalTaskImpl *)(p + 1));
        p->count = (RK_U32 *)(p->list + stage_cnt);
        p->tasks = (HalTaskImpl *)(p->count + stage_cnt);

        mpp_spinlock_init(&p->lock);

        for (i = 0; i < stage_cnt; i++)
            INIT_LIST_HEAD(&p->list[i]);

        buf = (RK_U8 *)(p->tasks + task_cnt);

        for (i = 0; i < task_cnt; i++) {
            HalTaskImpl *task = &p->tasks[i];

            INIT_LIST_HEAD(&task->list);
            task->index  = i;
            task->group  = p;
            task->status = TASK_IDLE;
            task->data   = buf + i * aligned_size;
            list_add_tail(&task->list, &p->list[TASK_IDLE]);
            p->count[TASK_IDLE]++;
        }
        *group = p;
        return MPP_OK;
    } while (0);

    MPP_FREE(p);

    *group = NULL;
    return MPP_NOK;
}